

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O1

void __thiscall OpenMD::GBtailVisitor::~GBtailVisitor(GBtailVisitor *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  
  (this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__ReplacementVisitor_002bf4d0;
  this_00 = (this->super_ReplacementVisitor).sites_.
            super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->super_ReplacementVisitor).myTypes_._M_t);
  (this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__BaseVisitor_002b9e60;
  pcVar2 = (this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor.visitorName.
           _M_dataplus._M_p;
  paVar1 = &(this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor.visitorName.
            field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x78);
  return;
}

Assistant:

GBtailVisitor(SimInfo* info) : ReplacementVisitor(info) {
      visitorName = "GBtailVisitor";

      /// these are the atom names we can replace with a fixed structure
      addReplacedAtomName("GBtail");

      // this is the reference structure we'll use for the replacement:
      addSite("C", Vector3d(0.0, 0.0, 9.0));
      addSite("C", Vector3d(0.0, 0.0, 0.0));
      addSite("C", Vector3d(0.0, 0.0, -9.0));
    }